

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O0

void __thiscall QStyleSheetBorderData::QStyleSheetBorderData(QStyleSheetBorderData *this)

{
  QStyleSheetBorderImageData *pQVar1;
  QStyleSheetBorderImageData *this_00;
  long in_RDI;
  int i;
  QStyleSheetBorderImageData *local_38;
  QBrush *local_18;
  int local_c;
  
  QSharedData::QSharedData((QSharedData *)0x44940c);
  local_18 = (QBrush *)(in_RDI + 0x18);
  do {
    QBrush::QBrush(local_18);
    local_18 = local_18 + 8;
  } while (local_18 != (QBrush *)(in_RDI + 0x38));
  this_00 = (QStyleSheetBorderImageData *)(in_RDI + 0x68);
  pQVar1 = (QStyleSheetBorderImageData *)(in_RDI + 0x48);
  do {
    local_38 = pQVar1;
    QSize::QSize((QSize *)this_00);
    pQVar1 = (QStyleSheetBorderImageData *)(local_38->cuts + 1);
  } while ((QStyleSheetBorderImageData *)(local_38->cuts + 1) != this_00);
  QSharedDataPointer<QStyleSheetBorderImageData>::QSharedDataPointer
            ((QSharedDataPointer<QStyleSheetBorderImageData> *)this_00,local_38);
  for (local_c = 0; local_c < 4; local_c = local_c + 1) {
    *(undefined4 *)(in_RDI + 4 + (long)local_c * 4) = 0;
    *(undefined4 *)(in_RDI + 0x38 + (long)local_c * 4) = 1;
  }
  return;
}

Assistant:

QStyleSheetBorderData() : bi(nullptr)
    {
        for (int i = 0; i < 4; i++) {
            borders[i] = 0;
            styles[i] = QCss::BorderStyle_None;
        }
    }